

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomLayoutDefault::write(DomLayoutDefault *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QString local_40;
  long local_28;
  
  aVar1._4_4_ = in_register_00000034;
  aVar1._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"layoutdefault";
    local_40.d.size = 0xd;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar2.m_size = (size_t)local_40.d.ptr;
  QVar2.field_0.m_data = aVar1.m_data;
  QXmlStreamWriter::writeStartElement(QVar2);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_spacing == true) {
    QString::number((int)&local_40,this->m_attr_spacing);
    QVar3.m_size = (size_t)L"spacing";
    QVar3.field_0.m_data = aVar1.m_data;
    QVar5.m_size = (size_t)local_40.d.ptr;
    QVar5.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
    QXmlStreamWriter::writeAttribute(QVar3,QVar5);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (this->m_has_attr_margin == true) {
    QString::number((int)&local_40,this->m_attr_margin);
    QVar4.m_size = (size_t)L"margin";
    QVar4.field_0.m_data = aVar1.m_data;
    QVar6.m_size = (size_t)local_40.d.ptr;
    QVar6.field_0.m_data = (void *)0x8000000000000006;
    QXmlStreamWriter::writeAttribute(QVar4,QVar6);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayoutDefault::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutdefault") : tagName.toLower());

    if (hasAttributeSpacing())
        writer.writeAttribute(u"spacing"_s, QString::number(attributeSpacing()));

    if (hasAttributeMargin())
        writer.writeAttribute(u"margin"_s, QString::number(attributeMargin()));

    writer.writeEndElement();
}